

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLaplacian::prepareForSolve(MLNodeLaplacian *this)

{
  MLNodeLinOp::prepareForSolve(&this->super_MLNodeLinOp);
  MLNodeLinOp::buildMasks(&this->super_MLNodeLinOp);
  averageDownCoeffs(this);
  buildIntegral(this);
  if (this->m_build_surface_integral == true) {
    buildSurfaceIntegral(this);
  }
  buildStencil(this);
  return;
}

Assistant:

void
MLNodeLaplacian::prepareForSolve ()
{
    BL_PROFILE("MLNodeLaplacian::prepareForSolve()");

    MLNodeLinOp::prepareForSolve();

    buildMasks();

    averageDownCoeffs();

#ifdef AMREX_USE_EB
    buildIntegral();
    if (m_build_surface_integral) buildSurfaceIntegral();
#endif

    buildStencil();
}